

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_policy_testing.h
# Opt level: O2

vector<int,_std::allocator<int>_> * __thiscall
phmap::priv::
keys<phmap::node_hash_set<int,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<int>>>
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,priv *this,
          node_hash_set<int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
          *s)

{
  long lVar1;
  long lVar2;
  node_hash_set<int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
  *__range2;
  const_iterator __begin0;
  iterator local_30;
  
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::reserve
            (__return_storage_ptr__,*(size_type *)(this + 0x10));
  local_30 = raw_hash_set<phmap::priv::NodeHashSetPolicy<int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
             ::begin((raw_hash_set<phmap::priv::NodeHashSetPolicy<int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
                      *)this);
  lVar1 = *(long *)this;
  lVar2 = *(long *)(this + 0x18);
  while (local_30.ctrl_ != (ctrl_t *)(lVar1 + lVar2)) {
    std::vector<int,std::allocator<int>>::emplace_back<int_const&>
              ((vector<int,std::allocator<int>> *)__return_storage_ptr__,*local_30.field_1.slot_);
    raw_hash_set<phmap::priv::NodeHashSetPolicy<int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
    ::iterator::operator++(&local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

auto keys(const Set& s)
    -> std::vector<typename std::decay<typename Set::key_type>::type> {
  std::vector<typename std::decay<typename Set::key_type>::type> res;
  res.reserve(s.size());
  for (const auto& v : s) res.emplace_back(v);
  return res;
}